

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O0

void __thiscall
dg::WalkAndMark<dg::LLVMNode>::WalkAndMark(WalkAndMark<dg::LLVMNode> *this,bool forward_slc)

{
  byte bVar1;
  byte in_SIL;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::NodesWalk
            ((NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)
             (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
             (uint32_t)((ulong)in_RDI >> 0x20));
  *in_RDI = &PTR_prepare_001fdb50;
  *(byte *)(in_RDI + 0xe) = bVar1 & 1;
  std::
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::set((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
         *)0x1c3c08);
  return;
}

Assistant:

WalkAndMark(bool forward_slc = false)
            : legacy::NodesWalk<NodeT, Queue>(
                      forward_slc
                              ? (legacy::NODES_WALK_DD | // legacy::NODES_WALK_CD
                                                         // NOTE: we handle CD
                                                         // separately
                                 legacy::NODES_WALK_USE | legacy::NODES_WALK_ID)
                              : (legacy::NODES_WALK_REV_CD |
                                 legacy::NODES_WALK_REV_DD |
                                 legacy::NODES_WALK_USER |
                                 legacy::NODES_WALK_ID |
                                 legacy::NODES_WALK_REV_ID)),
              forward_slice(forward_slc) {}